

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_data_source_seek_seconds
                    (ma_data_source *pDataSource,float secondCount,float *pSecondsSeeked)

{
  ma_result mVar1;
  ulong uVar2;
  ma_data_source_base *pDataSourceBase;
  float fVar3;
  ma_uint32 sampleRate;
  ma_uint64 framesSeeked;
  ma_uint32 channels;
  ma_format format;
  uint local_3c;
  ma_uint64 local_38;
  undefined1 local_30 [4];
  undefined1 local_2c [4];
  float local_28;
  
  local_38 = 0;
  if (pDataSource == (ma_data_source *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else if (*(code **)(*pDataSource + 0x10) == (code *)0x0) {
    mVar1 = MA_NOT_IMPLEMENTED;
  }
  else {
    local_28 = secondCount;
    mVar1 = (**(code **)(*pDataSource + 0x10))(pDataSource,local_2c,local_30,&local_3c,0,0);
    if (mVar1 == MA_SUCCESS) {
      fVar3 = local_28 * (float)local_3c;
      uVar2 = (ulong)fVar3;
      mVar1 = ma_data_source_read_pcm_frames
                        (pDataSource,(void *)0x0,
                         (long)(fVar3 - 9.223372e+18) & (long)uVar2 >> 0x3f | uVar2,&local_38);
      *pSecondsSeeked = (float)(long)local_38 / (float)local_3c;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_data_source_seek_seconds(ma_data_source* pDataSource, float secondCount, float* pSecondsSeeked)
{
    ma_uint64 frameCount;
    ma_uint64 framesSeeked = 0;
    ma_uint32 sampleRate;
    ma_result result;

    if (pDataSource == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_data_source_get_data_format(pDataSource, NULL, NULL, &sampleRate, NULL, 0);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* We need PCM frames instead of seconds */
    frameCount = (ma_uint64)(secondCount * sampleRate);

    result = ma_data_source_seek_pcm_frames(pDataSource, frameCount, &framesSeeked);

    /* VC6 doesn't support division between unsigned 64-bit integer and floating point number. Signed integer needed. This shouldn't affect anything in practice */
    *pSecondsSeeked = (ma_int64)framesSeeked / (float)sampleRate;
    return result;
}